

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int Ssw_SmlNodeNotEquWeight(Ssw_Sml_t *p,int Left,int Right)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = p->nWordsTotal;
  iVar3 = 0;
  for (lVar4 = (long)p->nWordsPref; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    iVar2 = Aig_WordCountOnes(*(uint *)((long)&p[1].pAig + lVar4 * 4 + (long)(Right * iVar1) * 4) ^
                              *(uint *)((long)&p[1].pAig + lVar4 * 4 + (long)(Left * iVar1) * 4));
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

int Ssw_SmlNodeNotEquWeight( Ssw_Sml_t * p, int Left, int Right )
{
    unsigned * pSimL, * pSimR;
    int k, Counter = 0;
    pSimL = Ssw_ObjSim( p, Left );
    pSimR = Ssw_ObjSim( p, Right );
    for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
        Counter += Aig_WordCountOnes( pSimL[k] ^ pSimR[k] );
    return Counter;
}